

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

int Jf_ObjCutFilter(Jf_Man_t *p,Jf_Cut_t **pSto,int c)

{
  Jf_Cut_t *pJVar1;
  Jf_Cut_t *pJVar2;
  uint uVar3;
  int nLits;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  
  if (p->pPars->fCutMin == 0) {
    if (0 < c) {
      pJVar1 = pSto[(uint)c];
      uVar5 = pJVar1->pCut[0] & 0xf;
      uVar6 = 0;
      do {
        pJVar2 = pSto[uVar6];
        if ((pJVar2->pCut[0] <= pJVar1->pCut[0]) && ((pJVar2->Sign & ~pJVar1->Sign) == 0)) {
          uVar4 = pJVar2->pCut[0] & 0xf;
          if (uVar5 == uVar4) {
            if (uVar5 == 0) {
              return 0;
            }
            uVar9 = 0;
            while (pJVar1->pCut[uVar9 + 1] == pJVar2->pCut[uVar9 + 1]) {
              uVar9 = uVar9 + 1;
              if (uVar5 == uVar9) {
                return 0;
              }
            }
          }
          else {
            if (uVar5 <= uVar4) {
              __assert_fail("nSizeB > nSizeC",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                            ,0x236,"int Jf_CutIsContainedOrder(int *, int *)");
            }
            uVar3 = 1;
            uVar9 = 0;
            do {
              if (pJVar2->pCut[(int)uVar3] < pJVar1->pCut[uVar9 + 1]) break;
              if (pJVar1->pCut[uVar9 + 1] == pJVar2->pCut[(int)uVar3]) {
                if (uVar3 == uVar4) {
                  return 0;
                }
                uVar3 = uVar3 + 1;
              }
              uVar9 = uVar9 + 1;
            } while (uVar5 != uVar9);
          }
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != (uint)c);
    }
  }
  else if (0 < c) {
    pJVar1 = pSto[(uint)c];
    uVar5 = pJVar1->pCut[0];
    uVar4 = uVar5 & 0xf;
    uVar6 = 0;
    do {
      pJVar2 = pSto[uVar6];
      uVar3 = pJVar2->pCut[0];
      if (((int)uVar3 <= (int)uVar5) && ((pJVar2->Sign & ~pJVar1->Sign) == 0)) {
        if ((uVar3 & 0xf) == 0) {
          return 0;
        }
        lVar7 = 1;
        do {
          if (pJVar2->pCut[lVar7] < 0) {
LAB_0075861f:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          if (uVar4 == 0) {
            iVar8 = 1;
          }
          else {
            uVar9 = 0;
            do {
              if (pJVar1->pCut[uVar9 + 1] < 0) goto LAB_0075861f;
              if ((uint)(pJVar1->pCut[uVar9 + 1] ^ pJVar2->pCut[lVar7]) < 2) {
                iVar8 = (int)uVar9 + 1;
                break;
              }
              uVar9 = uVar9 + 1;
              iVar8 = uVar4 + 1;
            } while (uVar4 != uVar9);
          }
          if ((int)uVar5 < iVar8) break;
          lVar7 = lVar7 + 1;
          if (lVar7 == ((ulong)uVar3 & 0xf) + 1) {
            return 0;
          }
        } while( true );
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)c);
  }
  return 1;
}

Assistant:

int Jf_ObjCutFilter( Jf_Man_t * p, Jf_Cut_t ** pSto, int c )
{
    int k;
    if ( p->pPars->fCutMin )
    {
        for ( k = 0; k < c; k++ )
            if ( pSto[c]->pCut[0] >= pSto[k]->pCut[0] && 
                (pSto[c]->Sign & pSto[k]->Sign) == pSto[k]->Sign && 
                 Jf_CutIsContained1(pSto[c]->pCut, pSto[k]->pCut) )
                 return 0;
    }
    else
    {
        for ( k = 0; k < c; k++ )
            if ( pSto[c]->pCut[0] >= pSto[k]->pCut[0] && 
                (pSto[c]->Sign & pSto[k]->Sign) == pSto[k]->Sign && 
                 Jf_CutIsContainedOrder(pSto[c]->pCut, pSto[k]->pCut) )
                 return 0;
    }
    return 1;
}